

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.cpp
# Opt level: O0

string * fs_normal_abi_cxx11_(string *__return_storage_ptr__,string_view path)

{
  string_view path_00;
  ulong uVar1;
  char *pcVar2;
  bool local_f3;
  bool local_f1;
  _Bool local_d9;
  string local_c8;
  path local_98;
  path local_70;
  string local_48;
  undefined1 local_21;
  undefined1 local_20 [8];
  string_view path_local;
  string *r;
  
  path_local._M_len = (size_t)path._M_str;
  local_20 = (undefined1  [8])path._M_len;
  local_21 = 0;
  path_local._M_str = (char *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_98,(basic_string_view<char,_std::char_traits<char>_> *)local_20,auto_format);
  std::filesystem::__cxx11::path::lexically_normal();
  std::filesystem::__cxx11::path::generic_string(&local_48,&local_70);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::filesystem::__cxx11::path::~path(&local_70);
  std::filesystem::__cxx11::path::~path(&local_98);
  uVar1 = std::__cxx11::string::length();
  local_d9 = false;
  local_f1 = false;
  if (1 < uVar1) {
    pcVar2 = (char *)std::__cxx11::string::back();
    local_f1 = false;
    if (*pcVar2 == '/') {
      local_d9 = fs_is_windows();
      local_f3 = true;
      if (local_d9) {
        path_00 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view
                            ((string *)__return_storage_ptr__);
        fs_root_abi_cxx11_(&local_c8,path_00);
        local_f3 = std::operator!=(__return_storage_ptr__,&local_c8);
      }
      local_f1 = local_f3;
    }
  }
  if (local_d9 != false) {
    std::__cxx11::string::~string((string *)&local_c8);
  }
  if (local_f1 != false) {
    std::__cxx11::string::pop_back();
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
fs_normal(std::string_view path)
{
  // normalize path
   std::string r;
#ifdef HAVE_CXX_FILESYSTEM
  r = std::filesystem::path(path).lexically_normal().generic_string();
#else
  // leave the empty short-circuit to avoid needless computation
  // and avoid indexing into an empty string
  if (path.empty())
    return ".";

  const std::vector<std::string> parts = fs_normal_vector(path);

  // rebuild path
   if (fs_slash_first(path))
     r.push_back('/');

  for (const auto& p : parts)
    r.append(p).push_back('/');

#endif

  // no trailing slash
  if (r.length() > 1 && r.back() == '/' && (!fs_is_windows() || r != fs_root(r)))
    r.pop_back();

  if (r.empty())
    r.push_back('.');

  return r;
}